

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O1

void __thiscall VmFunction::~VmFunction(VmFunction *this)

{
  (this->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmFunction_003f8d70;
  SmallArray<VmBlock_*,_4U>::~SmallArray(&this->restoreBlocks);
  SmallArray<VariableData_*,_4U>::~SmallArray(&this->allocas);
  (this->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_003f8ca8;
  SmallArray<VmValue_*,_8U>::~SmallArray(&(this->super_VmValue).users);
  operator_delete(this,0x170);
  return;
}

Assistant:

VmFunction(Allocator *allocator, VmType type, SynBase *source, FunctionData *function, ScopeData *scope, VmType returnType): VmValue(myTypeID, allocator, type, source), function(function), scope(scope), returnType(returnType), allocas(allocator), restoreBlocks(allocator)
	{
		firstBlock = NULL;
		lastBlock = NULL;

		nextBlockId = 1;
		nextInstructionId = 1;

		next = NULL;
		listed = false;

		checkedInline = false;
		canInline = false;

		vmAddress = ~0u;
		vmCodeSize = 0;

		regVmAddress = ~0u;
		regVmCodeSize = 0;
		regVmRegisters = 0;

		nextRestoreBlock = 0;

		nextColor = 0;
		nextSearchMarker = 1;
	}